

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

OptionContext * __thiscall
Potassco::ProgramOptions::OptionContext::add(OptionContext *this,OptionGroup *options)

{
  DescriptionLevel DVar1;
  pointer pcVar2;
  pointer pIVar3;
  pointer pOVar4;
  size_t groupId;
  DescriptionLevel DVar5;
  pointer opt;
  ulong uVar6;
  OptionGroup local_70;
  
  groupId = findGroupKey(this,&options->caption_);
  uVar6 = (long)(this->groups_).
                super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->groups_).
                super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  if (uVar6 <= groupId) {
    DVar1 = options->level_;
    local_70.caption_._M_dataplus._M_p = (pointer)&local_70.caption_.field_2;
    pcVar2 = (options->caption_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (options->caption_)._M_string_length);
    local_70.options_.
    super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.options_.
    super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.options_.
    super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.level_ = DVar1;
    std::
    vector<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
    ::emplace_back<Potassco::ProgramOptions::OptionGroup>(&this->groups_,&local_70);
    OptionGroup::~OptionGroup(&local_70);
    groupId = uVar6;
  }
  pIVar3 = (options->options_).
           super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (opt = (options->options_).
             super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
             ._M_impl.super__Vector_impl_data._M_start; opt != pIVar3; opt = opt + 1) {
    insertOption(this,groupId,opt);
  }
  pOVar4 = (this->groups_).
           super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  DVar1 = pOVar4[groupId].level_;
  DVar5 = options->level_;
  if ((int)DVar1 < (int)options->level_) {
    DVar5 = DVar1;
  }
  pOVar4[groupId].level_ = DVar5;
  return this;
}

Assistant:

OptionContext& OptionContext::add(const OptionGroup& options) {
	size_t k = findGroupKey(options.caption());
	if (k >= groups_.size()) {
		// add as new group
		k = groups_.size();
		groups_.push_back(OptionGroup(options.caption(), options.descLevel()));
	}
	for (option_iterator it = options.begin(), end = options.end(); it != end; ++it) {
		insertOption(k, *it);
	}
	groups_[k].setDescriptionLevel(std::min(options.descLevel(), groups_[k].descLevel()));
	return *this;
}